

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  BVH *bvh;
  NodeRef root;
  float *pfVar2;
  Geometry *pGVar3;
  RTCRayQueryContext *pRVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  size_t k;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  int iVar40;
  ulong uVar41;
  long lVar42;
  undefined1 (*pauVar43) [32];
  ulong uVar44;
  ulong uVar45;
  ulong *puVar46;
  undefined4 uVar47;
  ulong unaff_R15;
  ulong uVar48;
  bool bVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar66 [36];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [36];
  undefined1 auVar72 [64];
  float fVar74;
  float fVar75;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  uint uVar103;
  uint uVar104;
  uint uVar109;
  uint uVar110;
  uint uVar111;
  float fVar112;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5e69;
  ulong local_5e68;
  undefined1 local_5e60 [32];
  RayK<8> *local_5e40;
  undefined1 (*local_5e38) [32];
  RTCFilterFunctionNArguments local_5e30;
  undefined1 local_5e00 [8];
  undefined1 auStack_5df8 [8];
  float fStack_5df0;
  float fStack_5dec;
  float fStack_5de8;
  float fStack_5de4;
  undefined1 local_5de0 [8];
  float fStack_5dd8;
  float fStack_5dd4;
  float fStack_5dd0;
  float fStack_5dcc;
  float fStack_5dc8;
  float fStack_5dc4;
  undefined1 local_5dc0 [32];
  ulong local_5d90;
  Scene *local_5d88;
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [32];
  undefined1 local_5d00 [32];
  undefined1 local_5ce0 [8];
  float fStack_5cd8;
  float fStack_5cd4;
  float fStack_5cd0;
  float fStack_5ccc;
  float fStack_5cc8;
  float fStack_5cc4;
  undefined1 local_5cc0 [8];
  float fStack_5cb8;
  float fStack_5cb4;
  float fStack_5cb0;
  float fStack_5cac;
  float fStack_5ca8;
  float fStack_5ca4;
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [32];
  undefined1 local_5c60 [32];
  RTCHitN local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [32];
  uint local_5b60;
  uint uStack_5b5c;
  uint uStack_5b58;
  uint uStack_5b54;
  uint uStack_5b50;
  uint uStack_5b4c;
  uint uStack_5b48;
  uint uStack_5b44;
  uint local_5b40;
  uint uStack_5b3c;
  uint uStack_5b38;
  uint uStack_5b34;
  uint uStack_5b30;
  uint uStack_5b2c;
  uint uStack_5b28;
  uint uStack_5b24;
  undefined8 local_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined1 local_5ae0 [32];
  float local_5ac0;
  float fStack_5abc;
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  float fStack_5aa4;
  undefined1 local_5aa0 [32];
  float local_5a80;
  float fStack_5a7c;
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  float fStack_5a64;
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  float fStack_5a44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar67 [36];
  undefined1 auVar68 [36];
  
  bvh = (BVH *)This->ptr;
  local_5808 = (bvh->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar65 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar54 = ZEXT816(0) << 0x40;
      auVar76 = vpcmpeqd_avx2(auVar65,(undefined1  [32])valid_i->field_0);
      auVar65 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar54),5);
      auVar55 = auVar76 & auVar65;
      if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar55 >> 0x7f,0) != '\0') ||
            (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar55 >> 0xbf,0) != '\0') ||
          (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar55[0x1f] < '\0') {
        auVar65 = vandps_avx(auVar65,auVar76);
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        local_5ca0._8_4_ = 0x7fffffff;
        local_5ca0._0_8_ = 0x7fffffff7fffffff;
        local_5ca0._12_4_ = 0x7fffffff;
        local_5ca0._16_4_ = 0x7fffffff;
        local_5ca0._20_4_ = 0x7fffffff;
        local_5ca0._24_4_ = 0x7fffffff;
        local_5ca0._28_4_ = 0x7fffffff;
        auVar105._8_4_ = 0x219392ef;
        auVar105._0_8_ = 0x219392ef219392ef;
        auVar105._12_4_ = 0x219392ef;
        auVar105._16_4_ = 0x219392ef;
        auVar105._20_4_ = 0x219392ef;
        auVar105._24_4_ = 0x219392ef;
        auVar105._28_4_ = 0x219392ef;
        auVar55 = vandps_avx(local_5ca0,local_59e0);
        auVar55 = vcmpps_avx(auVar55,auVar105,1);
        auVar76 = vblendvps_avx(local_59e0,auVar105,auVar55);
        auVar55 = vandps_avx(local_5ca0,local_59c0);
        auVar55 = vcmpps_avx(auVar55,auVar105,1);
        auVar70 = vblendvps_avx(local_59c0,auVar105,auVar55);
        auVar55 = vandps_avx(local_59a0,local_5ca0);
        auVar55 = vcmpps_avx(auVar55,auVar105,1);
        auVar55 = vblendvps_avx(local_59a0,auVar105,auVar55);
        auVar6 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
        auVar65 = vrcpps_avx(auVar76);
        auVar106._8_4_ = 0x3f800000;
        auVar106._0_8_ = 0x3f8000003f800000;
        auVar106._12_4_ = 0x3f800000;
        auVar106._16_4_ = 0x3f800000;
        auVar106._20_4_ = 0x3f800000;
        auVar106._24_4_ = 0x3f800000;
        auVar106._28_4_ = 0x3f800000;
        auVar13 = vfnmadd213ps_fma(auVar76,auVar65,auVar106);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar65,auVar65);
        auVar65 = vrcpps_avx(auVar70);
        auVar14 = vfnmadd213ps_fma(auVar70,auVar65,auVar106);
        auVar76 = vrcpps_avx(auVar55);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar65,auVar65);
        auVar15 = vfnmadd213ps_fma(auVar55,auVar76,auVar106);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar76,auVar76);
        local_5980 = ZEXT1632(auVar13);
        local_5960 = ZEXT1632(auVar14);
        local_5940 = ZEXT1632(auVar15);
        local_5920 = auVar13._0_4_ * (float)local_5a40._0_4_;
        fStack_591c = auVar13._4_4_ * (float)local_5a40._4_4_;
        fStack_5918 = auVar13._8_4_ * (float)local_5a40._8_4_;
        fStack_5914 = auVar13._12_4_ * (float)local_5a40._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar14._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar14._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar14._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar14._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0 = (float)local_5a40._64_4_ * auVar15._0_4_;
        fStack_58dc = (float)local_5a40._68_4_ * auVar15._4_4_;
        fStack_58d8 = (float)local_5a40._72_4_ * auVar15._8_4_;
        fStack_58d4 = (float)local_5a40._76_4_ * auVar15._12_4_;
        fStack_58d0 = (float)local_5a40._80_4_ * 0.0;
        fStack_58cc = (float)local_5a40._84_4_ * 0.0;
        fStack_58c8 = (float)local_5a40._88_4_ * 0.0;
        auVar65 = vcmpps_avx(local_5980,ZEXT1632(auVar54),1);
        auVar76._8_4_ = 0x20;
        auVar76._0_8_ = 0x2000000020;
        auVar76._12_4_ = 0x20;
        auVar76._16_4_ = 0x20;
        auVar76._20_4_ = 0x20;
        auVar76._24_4_ = 0x20;
        auVar76._28_4_ = 0x20;
        local_58c0 = vandps_avx(auVar65,auVar76);
        auVar55 = ZEXT1632(auVar54);
        auVar65 = vcmpps_avx(ZEXT1632(auVar14),auVar55,5);
        auVar70._8_4_ = 0x40;
        auVar70._0_8_ = 0x4000000040;
        auVar70._12_4_ = 0x40;
        auVar70._16_4_ = 0x40;
        auVar70._20_4_ = 0x40;
        auVar70._24_4_ = 0x40;
        auVar70._28_4_ = 0x40;
        auVar84._8_4_ = 0x60;
        auVar84._0_8_ = 0x6000000060;
        auVar84._12_4_ = 0x60;
        auVar84._16_4_ = 0x60;
        auVar84._20_4_ = 0x60;
        auVar84._24_4_ = 0x60;
        auVar84._28_4_ = 0x60;
        local_58a0 = vblendvps_avx(auVar84,auVar70,auVar65);
        auVar65 = vcmpps_avx(ZEXT1632(auVar15),auVar55,5);
        auVar77._8_4_ = 0x80;
        auVar77._0_8_ = 0x8000000080;
        auVar77._12_4_ = 0x80;
        auVar77._16_4_ = 0x80;
        auVar77._20_4_ = 0x80;
        auVar77._24_4_ = 0x80;
        auVar77._28_4_ = 0x80;
        auVar85._8_4_ = 0xa0;
        auVar85._0_8_ = 0xa0000000a0;
        auVar85._12_4_ = 0xa0;
        auVar85._16_4_ = 0xa0;
        auVar85._20_4_ = 0xa0;
        auVar85._24_4_ = 0xa0;
        auVar85._28_4_ = 0xa0;
        local_5880 = vblendvps_avx(auVar85,auVar77,auVar65);
        auVar65 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar55);
        local_5ae0 = vpmovsxwd_avx2(auVar6);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar108 = ZEXT3264(local_4680);
        local_5860 = vblendvps_avx(local_4680,auVar65,local_5ae0);
        auVar65 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar55);
        auVar55._8_4_ = 0xff800000;
        auVar55._0_8_ = 0xff800000ff800000;
        auVar55._12_4_ = 0xff800000;
        auVar55._16_4_ = 0xff800000;
        auVar55._20_4_ = 0xff800000;
        auVar55._24_4_ = 0xff800000;
        auVar55._28_4_ = 0xff800000;
        local_5840 = vblendvps_avx(auVar55,auVar65,local_5ae0);
        auVar54 = vpcmpeqd_avx(local_5840._0_16_,local_5840._0_16_);
        local_5d40 = vpmovsxwd_avx2(auVar6 ^ auVar54);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar45 = 7;
        }
        else {
          uVar45 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5e40 = ray + 0x100;
        puVar46 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar43 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5860;
        local_5b00 = mm_lookupmask_ps._16_8_;
        uStack_5af8 = mm_lookupmask_ps._24_8_;
        uStack_5af0 = mm_lookupmask_ps._16_8_;
        uStack_5ae8 = mm_lookupmask_ps._24_8_;
        local_5e38 = (undefined1 (*) [32])&local_5b60;
        local_5b20 = mm_lookupmask_pd._0_8_;
        uStack_5b18 = mm_lookupmask_pd._8_8_;
        uStack_5b10 = mm_lookupmask_pd._0_8_;
        uStack_5b08 = mm_lookupmask_pd._8_8_;
        auVar65 = vpcmpeqd_avx2(local_5ca0,local_5ca0);
        auVar114 = ZEXT3264(auVar65);
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
        uStack_58c4 = local_5a40._92_4_;
LAB_00605f27:
        do {
          do {
            root.ptr = puVar46[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_00606dda;
            puVar46 = puVar46 + -1;
            pauVar43 = pauVar43 + -1;
            _local_5e00 = *pauVar43;
            auVar65 = vcmpps_avx(_local_5e00,local_5840,1);
          } while ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar65 >> 0x7f,0) == '\0') &&
                     (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar65 >> 0xbf,0) == '\0') &&
                   (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar65[0x1f]);
          uVar47 = vmovmskps_avx(auVar65);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar47);
          if (uVar45 < CONCAT44(0,POPCOUNT(uVar47))) {
LAB_00605f65:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_00606dda;
                auVar65 = vcmpps_avx(local_5840,_local_5e00,6);
                if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar65 >> 0x7f,0) == '\0') &&
                      (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar65 >> 0xbf,0) == '\0') &&
                    (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar65[0x1f]) goto LAB_00605f27;
                local_5d90 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar53 = local_5d40;
                if (local_5d90 == 0) goto LAB_00606cb1;
                auVar56._0_4_ = auVar114._0_4_ ^ local_5d40._0_4_;
                auVar56._4_4_ = auVar114._4_4_ ^ local_5d40._4_4_;
                auVar56._8_4_ = auVar114._8_4_ ^ local_5d40._8_4_;
                auVar56._12_4_ = auVar114._12_4_ ^ local_5d40._12_4_;
                auVar56._16_4_ = auVar114._16_4_ ^ local_5d40._16_4_;
                auVar56._20_4_ = auVar114._20_4_ ^ local_5d40._20_4_;
                auVar56._24_4_ = auVar114._24_4_ ^ local_5d40._24_4_;
                auVar56._28_4_ = auVar114._28_4_ ^ local_5d40._28_4_;
                lVar42 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                uVar41 = 0;
                goto LAB_00606137;
              }
              lVar42 = 0;
              uVar41 = 8;
              _local_5e00 = auVar108._0_32_;
              do {
                uVar48 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar42 * 8);
                if (uVar48 == 8) break;
                uVar47 = *(undefined4 *)(root.ptr + 0x40 + lVar42 * 4);
                auVar62._4_4_ = uVar47;
                auVar62._0_4_ = uVar47;
                auVar62._8_4_ = uVar47;
                auVar62._12_4_ = uVar47;
                auVar62._16_4_ = uVar47;
                auVar62._20_4_ = uVar47;
                auVar62._24_4_ = uVar47;
                auVar62._28_4_ = uVar47;
                auVar37._4_4_ = fStack_591c;
                auVar37._0_4_ = local_5920;
                auVar37._8_4_ = fStack_5918;
                auVar37._12_4_ = fStack_5914;
                auVar37._16_4_ = fStack_5910;
                auVar37._20_4_ = fStack_590c;
                auVar37._24_4_ = fStack_5908;
                auVar37._28_4_ = uStack_5904;
                uVar47 = *(undefined4 *)(root.ptr + 0x80 + lVar42 * 4);
                auVar89._4_4_ = uVar47;
                auVar89._0_4_ = uVar47;
                auVar89._8_4_ = uVar47;
                auVar89._12_4_ = uVar47;
                auVar89._16_4_ = uVar47;
                auVar89._20_4_ = uVar47;
                auVar89._24_4_ = uVar47;
                auVar89._28_4_ = uVar47;
                auVar54 = vfmsub213ps_fma(auVar62,local_5980,auVar37);
                auVar38._4_4_ = fStack_58fc;
                auVar38._0_4_ = local_5900;
                auVar38._8_4_ = fStack_58f8;
                auVar38._12_4_ = fStack_58f4;
                auVar38._16_4_ = fStack_58f0;
                auVar38._20_4_ = fStack_58ec;
                auVar38._24_4_ = fStack_58e8;
                auVar38._28_4_ = uStack_58e4;
                uVar47 = *(undefined4 *)(root.ptr + 0xc0 + lVar42 * 4);
                auVar96._4_4_ = uVar47;
                auVar96._0_4_ = uVar47;
                auVar96._8_4_ = uVar47;
                auVar96._12_4_ = uVar47;
                auVar96._16_4_ = uVar47;
                auVar96._20_4_ = uVar47;
                auVar96._24_4_ = uVar47;
                auVar96._28_4_ = uVar47;
                auVar6 = vfmsub213ps_fma(auVar89,local_5960,auVar38);
                auVar39._4_4_ = fStack_58dc;
                auVar39._0_4_ = local_58e0;
                auVar39._8_4_ = fStack_58d8;
                auVar39._12_4_ = fStack_58d4;
                auVar39._16_4_ = fStack_58d0;
                auVar39._20_4_ = fStack_58cc;
                auVar39._24_4_ = fStack_58c8;
                auVar39._28_4_ = uStack_58c4;
                uVar47 = *(undefined4 *)(root.ptr + 0x60 + lVar42 * 4);
                auVar101._4_4_ = uVar47;
                auVar101._0_4_ = uVar47;
                auVar101._8_4_ = uVar47;
                auVar101._12_4_ = uVar47;
                auVar101._16_4_ = uVar47;
                auVar101._20_4_ = uVar47;
                auVar101._24_4_ = uVar47;
                auVar101._28_4_ = uVar47;
                auVar13 = vfmsub213ps_fma(auVar96,local_5940,auVar39);
                auVar14 = vfmsub213ps_fma(auVar101,local_5980,auVar37);
                uVar47 = *(undefined4 *)(root.ptr + 0xa0 + lVar42 * 4);
                auVar86._4_4_ = uVar47;
                auVar86._0_4_ = uVar47;
                auVar86._8_4_ = uVar47;
                auVar86._12_4_ = uVar47;
                auVar86._16_4_ = uVar47;
                auVar86._20_4_ = uVar47;
                auVar86._24_4_ = uVar47;
                auVar86._28_4_ = uVar47;
                auVar15 = vfmsub213ps_fma(auVar86,local_5960,auVar38);
                uVar47 = *(undefined4 *)(root.ptr + 0xe0 + lVar42 * 4);
                auVar69._4_4_ = uVar47;
                auVar69._0_4_ = uVar47;
                auVar69._8_4_ = uVar47;
                auVar69._12_4_ = uVar47;
                auVar69._16_4_ = uVar47;
                auVar69._20_4_ = uVar47;
                auVar69._24_4_ = uVar47;
                auVar69._28_4_ = uVar47;
                auVar10 = vfmsub213ps_fma(auVar69,local_5940,auVar39);
                auVar65 = vpminsd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar14));
                auVar55 = vpminsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar15));
                auVar65 = vpmaxsd_avx2(auVar65,auVar55);
                auVar55 = vpminsd_avx2(ZEXT1632(auVar13),ZEXT1632(auVar10));
                auVar76 = vpmaxsd_avx2(auVar65,auVar55);
                auVar65 = vpmaxsd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar14));
                auVar55 = vpmaxsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar15));
                auVar55 = vpminsd_avx2(auVar65,auVar55);
                auVar65 = vpmaxsd_avx2(ZEXT1632(auVar13),ZEXT1632(auVar10));
                auVar55 = vpminsd_avx2(auVar55,auVar65);
                auVar65 = vpmaxsd_avx2(auVar76,local_5860);
                auVar55 = vpminsd_avx2(auVar55,local_5840);
                auVar55 = vcmpps_avx(auVar65,auVar55,2);
                uVar44 = uVar41;
                auVar65 = _local_5e00;
                if (((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar55 >> 0x7f,0) != '\0') ||
                       (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar55 >> 0xbf,0) != '\0') ||
                     (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar55[0x1f] < '\0') &&
                   (auVar65 = vblendvps_avx(auVar108._0_32_,auVar76,auVar55), uVar44 = uVar48,
                   uVar41 != 8)) {
                  *puVar46 = uVar41;
                  puVar46 = puVar46 + 1;
                  *pauVar43 = _local_5e00;
                  pauVar43 = pauVar43 + 1;
                }
                _local_5e00 = auVar65;
                uVar41 = uVar44;
                lVar42 = lVar42 + 1;
              } while (lVar42 != 8);
              if (uVar41 == 8) goto LAB_00606c9c;
              auVar65 = vcmpps_avx(local_5840,_local_5e00,6);
              uVar47 = vmovmskps_avx(auVar65);
              root.ptr = uVar41;
            } while ((byte)uVar45 < (byte)POPCOUNT(uVar47));
            *puVar46 = uVar41;
            puVar46 = puVar46 + 1;
            *pauVar43 = _local_5e00;
            pauVar43 = pauVar43 + 1;
LAB_00606c9c:
            iVar40 = 4;
          }
          else {
            local_5de0 = (undefined1  [8])CONCAT44(0,POPCOUNT(uVar47));
            while (unaff_R15 != 0) {
              k = 0;
              for (uVar41 = unaff_R15; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000)
              {
                k = k + 1;
              }
              local_5e60._0_8_ = k;
              auVar65 = ZEXT1632(auVar114._0_16_);
              bVar49 = occluded1(This,bvh,root,k,&local_5e69,ray,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,context);
              if (bVar49) {
                *(undefined4 *)(local_5d40 + local_5e60._0_8_ * 4) = 0xffffffff;
              }
              unaff_R15 = unaff_R15 - 1 & unaff_R15;
              auVar108 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar65 = vpcmpeqd_avx2(auVar65,auVar65);
              auVar114 = ZEXT3264(auVar65);
            }
            auVar65 = auVar114._0_32_ & ~local_5d40;
            iVar40 = 3;
            if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar65 >> 0x7f,0) != '\0') ||
                  (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar65 >> 0xbf,0) != '\0') ||
                (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar65[0x1f] < '\0') {
              auVar65._8_4_ = 0xff800000;
              auVar65._0_8_ = 0xff800000ff800000;
              auVar65._12_4_ = 0xff800000;
              auVar65._16_4_ = 0xff800000;
              auVar65._20_4_ = 0xff800000;
              auVar65._24_4_ = 0xff800000;
              auVar65._28_4_ = 0xff800000;
              local_5840 = vblendvps_avx(local_5840,auVar65,local_5d40);
              iVar40 = 2;
            }
            unaff_R15 = 0;
            if ((uint)uVar45 < (uint)local_5de0._0_4_) goto LAB_00605f65;
          }
        } while (iVar40 != 3);
LAB_00606dda:
        auVar65 = vandps_avx(local_5ae0,local_5d40);
        auVar61._8_4_ = 0xff800000;
        auVar61._0_8_ = 0xff800000ff800000;
        auVar61._12_4_ = 0xff800000;
        auVar61._16_4_ = 0xff800000;
        auVar61._20_4_ = 0xff800000;
        auVar61._24_4_ = 0xff800000;
        auVar61._28_4_ = 0xff800000;
        auVar65 = vmaskmovps_avx(auVar65,auVar61);
        *(undefined1 (*) [32])local_5e40 = auVar65;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar41 = local_5e68 + 1;
    lVar42 = lVar42 + 0x60;
    if (local_5d90 <= uVar41) break;
LAB_00606137:
    local_5d88 = context->scene;
    uVar48 = 0;
    auVar65 = auVar56;
    local_5e68 = uVar41;
    local_5c60 = auVar56;
    while (iVar40 = *(int *)(lVar42 + uVar48 * 4), unaff_R15 = uVar48, iVar40 != -1) {
      uVar104 = *(uint *)(lVar42 + -0x10 + uVar48 * 4);
      pfVar2 = (local_5d88->vertices).items[uVar104];
      uVar44 = (ulong)*(uint *)(lVar42 + -0x50 + uVar48 * 4);
      uVar41 = (ulong)*(uint *)(lVar42 + -0x40 + uVar48 * 4);
      fVar75 = pfVar2[uVar44];
      auVar87._4_4_ = fVar75;
      auVar87._0_4_ = fVar75;
      auVar87._8_4_ = fVar75;
      auVar87._12_4_ = fVar75;
      auVar87._16_4_ = fVar75;
      auVar87._20_4_ = fVar75;
      auVar87._24_4_ = fVar75;
      auVar87._28_4_ = fVar75;
      fVar81 = pfVar2[uVar44 + 1];
      auVar92._4_4_ = fVar81;
      auVar92._0_4_ = fVar81;
      auVar92._8_4_ = fVar81;
      auVar92._12_4_ = fVar81;
      auVar92._16_4_ = fVar81;
      auVar92._20_4_ = fVar81;
      auVar92._24_4_ = fVar81;
      auVar92._28_4_ = fVar81;
      fVar112 = pfVar2[uVar44 + 2];
      auVar97._4_4_ = fVar112;
      auVar97._0_4_ = fVar112;
      auVar97._8_4_ = fVar112;
      auVar97._12_4_ = fVar112;
      auVar97._16_4_ = fVar112;
      auVar97._20_4_ = fVar112;
      auVar97._24_4_ = fVar112;
      auVar97._28_4_ = fVar112;
      local_5e00._4_4_ = pfVar2[uVar41];
      local_5de0._4_4_ = pfVar2[uVar41 + 1];
      local_5cc0._4_4_ = pfVar2[uVar41 + 2];
      uVar41 = (ulong)*(uint *)(lVar42 + -0x20 + uVar48 * 4);
      local_5ce0._4_4_ = pfVar2[uVar41];
      local_5a60 = pfVar2[uVar41 + 1];
      local_5a80 = pfVar2[uVar41 + 2];
      local_5e00._0_4_ = local_5e00._4_4_;
      auStack_5df8._0_4_ = local_5e00._4_4_;
      auStack_5df8._4_4_ = local_5e00._4_4_;
      fStack_5df0 = (float)local_5e00._4_4_;
      fStack_5dec = (float)local_5e00._4_4_;
      fStack_5de8 = (float)local_5e00._4_4_;
      fStack_5de4 = (float)local_5e00._4_4_;
      fVar82 = fVar75 - (float)local_5e00._4_4_;
      auVar117._4_4_ = fVar82;
      auVar117._0_4_ = fVar82;
      auVar117._8_4_ = fVar82;
      auVar117._12_4_ = fVar82;
      auVar117._16_4_ = fVar82;
      auVar117._20_4_ = fVar82;
      auVar117._24_4_ = fVar82;
      auVar117._28_4_ = fVar82;
      local_5de0._0_4_ = local_5de0._4_4_;
      fStack_5dd8 = (float)local_5de0._4_4_;
      fStack_5dd4 = (float)local_5de0._4_4_;
      fStack_5dd0 = (float)local_5de0._4_4_;
      fStack_5dcc = (float)local_5de0._4_4_;
      fStack_5dc8 = (float)local_5de0._4_4_;
      fStack_5dc4 = (float)local_5de0._4_4_;
      fVar80 = fVar81 - (float)local_5de0._4_4_;
      local_5cc0._0_4_ = local_5cc0._4_4_;
      fStack_5cb8 = (float)local_5cc0._4_4_;
      fStack_5cb4 = (float)local_5cc0._4_4_;
      fStack_5cb0 = (float)local_5cc0._4_4_;
      fStack_5cac = (float)local_5cc0._4_4_;
      fStack_5ca8 = (float)local_5cc0._4_4_;
      fStack_5ca4 = (float)local_5cc0._4_4_;
      fVar83 = fVar112 - (float)local_5cc0._4_4_;
      local_5d20._4_4_ = fVar83;
      local_5d20._0_4_ = fVar83;
      local_5d20._8_4_ = fVar83;
      local_5d20._12_4_ = fVar83;
      local_5d20._16_4_ = fVar83;
      local_5d20._20_4_ = fVar83;
      local_5d20._24_4_ = fVar83;
      local_5d20._28_4_ = fVar83;
      local_5ce0._0_4_ = local_5ce0._4_4_;
      fStack_5cd8 = (float)local_5ce0._4_4_;
      fStack_5cd4 = (float)local_5ce0._4_4_;
      fStack_5cd0 = (float)local_5ce0._4_4_;
      fStack_5ccc = (float)local_5ce0._4_4_;
      fStack_5cc8 = (float)local_5ce0._4_4_;
      fStack_5cc4 = (float)local_5ce0._4_4_;
      fVar75 = (float)local_5ce0._4_4_ - fVar75;
      auVar107._4_4_ = fVar75;
      auVar107._0_4_ = fVar75;
      auVar107._8_4_ = fVar75;
      auVar107._12_4_ = fVar75;
      auVar107._16_4_ = fVar75;
      auVar107._20_4_ = fVar75;
      auVar107._24_4_ = fVar75;
      auVar107._28_4_ = fVar75;
      fVar75 = fVar83 * fVar75;
      fVar81 = local_5a60 - fVar81;
      fVar74 = fVar82 * fVar81;
      auVar113._4_4_ = fVar81;
      auVar113._0_4_ = fVar81;
      auVar113._8_4_ = fVar81;
      auVar113._12_4_ = fVar81;
      auVar113._16_4_ = fVar81;
      auVar113._20_4_ = fVar81;
      auVar113._24_4_ = fVar81;
      auVar113._28_4_ = fVar81;
      local_5d00._4_4_ = fVar80;
      local_5d00._0_4_ = fVar80;
      local_5d00._8_4_ = fVar80;
      local_5d00._12_4_ = fVar80;
      local_5d00._16_4_ = fVar80;
      local_5d00._20_4_ = fVar80;
      local_5d00._24_4_ = fVar80;
      local_5d00._28_4_ = fVar80;
      fVar81 = local_5a80 - fVar112;
      fVar80 = fVar80 * fVar81;
      auVar115._4_4_ = fVar81;
      auVar115._0_4_ = fVar81;
      auVar115._8_4_ = fVar81;
      auVar115._12_4_ = fVar81;
      auVar115._16_4_ = fVar81;
      auVar115._20_4_ = fVar81;
      auVar115._24_4_ = fVar81;
      auVar115._28_4_ = fVar81;
      auVar50._4_4_ = fVar80;
      auVar50._0_4_ = fVar80;
      auVar50._8_4_ = fVar80;
      auVar50._12_4_ = fVar80;
      auVar50._16_4_ = fVar80;
      auVar50._20_4_ = fVar80;
      auVar50._24_4_ = fVar80;
      auVar50._28_4_ = fVar80;
      auVar13 = vfmsub231ps_fma(auVar50,auVar113,local_5d20);
      auVar57._4_4_ = fVar75;
      auVar57._0_4_ = fVar75;
      auVar57._8_4_ = fVar75;
      auVar57._12_4_ = fVar75;
      auVar57._16_4_ = fVar75;
      auVar57._20_4_ = fVar75;
      auVar57._24_4_ = fVar75;
      auVar57._28_4_ = fVar75;
      auVar14 = vfmsub231ps_fma(auVar57,auVar115,auVar117);
      auVar63._4_4_ = fVar74;
      auVar63._0_4_ = fVar74;
      auVar63._8_4_ = fVar74;
      auVar63._12_4_ = fVar74;
      auVar63._16_4_ = fVar74;
      auVar63._20_4_ = fVar74;
      auVar63._24_4_ = fVar74;
      auVar63._28_4_ = fVar74;
      auVar15 = vfmsub231ps_fma(auVar63,auVar107,local_5d00);
      auVar68 = (undefined1  [36])0x0;
      auVar67 = (undefined1  [36])0x0;
      auVar66 = (undefined1  [36])0x0;
      auVar77 = vsubps_avx(auVar87,*(undefined1 (*) [32])ray);
      auVar84 = vsubps_avx(auVar92,*(undefined1 (*) [32])(ray + 0x20));
      auVar85 = vsubps_avx(auVar97,*(undefined1 (*) [32])(ray + 0x40));
      auVar55 = *(undefined1 (*) [32])(ray + 0x80);
      auVar76 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar7._4_4_ = auVar55._4_4_ * auVar84._4_4_;
      auVar7._0_4_ = auVar55._0_4_ * auVar84._0_4_;
      auVar7._8_4_ = auVar55._8_4_ * auVar84._8_4_;
      auVar7._12_4_ = auVar55._12_4_ * auVar84._12_4_;
      auVar7._16_4_ = auVar55._16_4_ * auVar84._16_4_;
      auVar7._20_4_ = auVar55._20_4_ * auVar84._20_4_;
      auVar7._24_4_ = auVar55._24_4_ * auVar84._24_4_;
      auVar7._28_4_ = fVar82;
      auVar10 = vfmsub231ps_fma(auVar7,auVar77,auVar76);
      auVar70 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar8._4_4_ = auVar15._4_4_ * auVar70._4_4_;
      auVar8._0_4_ = auVar15._0_4_ * auVar70._0_4_;
      auVar8._8_4_ = auVar15._8_4_ * auVar70._8_4_;
      auVar8._12_4_ = auVar15._12_4_ * auVar70._12_4_;
      auVar8._16_4_ = auVar70._16_4_ * 0.0;
      auVar8._20_4_ = auVar70._20_4_ * 0.0;
      auVar8._24_4_ = auVar70._24_4_ * 0.0;
      auVar8._28_4_ = fVar112;
      auVar54 = vfmadd231ps_fma(auVar8,ZEXT1632(auVar14),auVar76);
      auVar9._4_4_ = auVar85._4_4_ * auVar76._4_4_;
      auVar9._0_4_ = auVar85._0_4_ * auVar76._0_4_;
      auVar9._8_4_ = auVar85._8_4_ * auVar76._8_4_;
      auVar9._12_4_ = auVar85._12_4_ * auVar76._12_4_;
      auVar9._16_4_ = auVar85._16_4_ * auVar76._16_4_;
      auVar9._20_4_ = auVar85._20_4_ * auVar76._20_4_;
      auVar9._24_4_ = auVar85._24_4_ * auVar76._24_4_;
      auVar9._28_4_ = fVar83;
      auVar11 = vfmsub231ps_fma(auVar9,auVar84,auVar70);
      auVar79._4_4_ = auVar70._4_4_ * auVar77._4_4_;
      auVar79._0_4_ = auVar70._0_4_ * auVar77._0_4_;
      auVar79._8_4_ = auVar70._8_4_ * auVar77._8_4_;
      auVar79._12_4_ = auVar70._12_4_ * auVar77._12_4_;
      auVar79._16_4_ = auVar70._16_4_ * auVar77._16_4_;
      auVar79._20_4_ = auVar70._20_4_ * auVar77._20_4_;
      auVar79._24_4_ = auVar70._24_4_ * auVar77._24_4_;
      auVar79._28_4_ = auVar76._28_4_;
      auVar12 = vfmsub231ps_fma(auVar79,auVar85,auVar55);
      auVar73 = (undefined1  [36])0x0;
      auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),ZEXT1632(auVar13),auVar55);
      auVar16._4_4_ = fVar81 * auVar10._4_4_;
      auVar16._0_4_ = fVar81 * auVar10._0_4_;
      auVar16._8_4_ = fVar81 * auVar10._8_4_;
      auVar16._12_4_ = fVar81 * auVar10._12_4_;
      auVar16._16_4_ = fVar81 * 0.0;
      auVar16._20_4_ = fVar81 * 0.0;
      auVar16._24_4_ = fVar81 * 0.0;
      auVar16._28_4_ = auVar70._28_4_;
      auVar108 = ZEXT3264(auVar65);
      auVar6 = vfmadd231ps_fma(auVar16,ZEXT1632(auVar12),auVar113);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar11),auVar107);
      uVar41 = (ulong)*(uint *)(lVar42 + -0x30 + uVar48 * 4);
      local_5aa0._8_4_ = 0x80000000;
      local_5aa0._0_8_ = 0x8000000080000000;
      local_5aa0._12_4_ = 0x80000000;
      local_5aa0._16_4_ = 0x80000000;
      local_5aa0._20_4_ = 0x80000000;
      local_5aa0._24_4_ = 0x80000000;
      local_5aa0._28_4_ = 0x80000000;
      auVar55 = vandps_avx(ZEXT1632(auVar54),local_5aa0);
      uVar103 = auVar55._0_4_;
      auVar99._0_4_ = (float)(uVar103 ^ auVar6._0_4_);
      uVar109 = auVar55._4_4_;
      auVar99._4_4_ = (float)(uVar109 ^ auVar6._4_4_);
      uVar110 = auVar55._8_4_;
      auVar99._8_4_ = (float)(uVar110 ^ auVar6._8_4_);
      uVar111 = auVar55._12_4_;
      auVar99._12_4_ = (float)(uVar111 ^ auVar6._12_4_);
      fVar112 = auVar55._16_4_;
      auVar99._16_4_ = fVar112;
      fVar74 = auVar55._20_4_;
      auVar99._20_4_ = fVar74;
      fVar80 = auVar55._24_4_;
      auVar99._24_4_ = fVar80;
      uVar47 = auVar55._28_4_;
      auVar99._28_4_ = uVar47;
      auVar55 = vcmpps_avx(auVar99,_DAT_01faff00,5);
      auVar76 = auVar65 & auVar55;
      fVar75 = pfVar2[uVar41];
      auVar78._4_4_ = fVar75;
      auVar78._0_4_ = fVar75;
      auVar78._8_4_ = fVar75;
      auVar78._12_4_ = fVar75;
      auVar78._16_4_ = fVar75;
      auVar78._20_4_ = fVar75;
      auVar78._24_4_ = fVar75;
      auVar78._28_4_ = fVar75;
      local_5ac0 = pfVar2[uVar41 + 1];
      fVar81 = pfVar2[uVar41 + 2];
      local_5d60._4_4_ = fVar81;
      local_5d60._0_4_ = fVar81;
      local_5d60._8_4_ = fVar81;
      local_5d60._12_4_ = fVar81;
      local_5d60._16_4_ = fVar81;
      local_5d60._20_4_ = fVar81;
      local_5d60._24_4_ = fVar81;
      local_5d60._28_4_ = fVar81;
      local_5e60 = auVar65;
      fStack_5abc = local_5ac0;
      fStack_5ab8 = local_5ac0;
      fStack_5ab4 = local_5ac0;
      fStack_5ab0 = local_5ac0;
      fStack_5aac = local_5ac0;
      fStack_5aa8 = local_5ac0;
      fStack_5aa4 = local_5ac0;
      fStack_5a7c = local_5a80;
      fStack_5a78 = local_5a80;
      fStack_5a74 = local_5a80;
      fStack_5a70 = local_5a80;
      fStack_5a6c = local_5a80;
      fStack_5a68 = local_5a80;
      fStack_5a64 = local_5a80;
      fStack_5a5c = local_5a60;
      fStack_5a58 = local_5a60;
      fStack_5a54 = local_5a60;
      fStack_5a50 = local_5a60;
      fStack_5a4c = local_5a60;
      fStack_5a48 = local_5a60;
      fStack_5a44 = local_5a60;
      auVar70 = local_5d60;
      if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar76 >> 0x7f,0) != '\0') ||
            (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar76 >> 0xbf,0) != '\0') ||
          (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar76[0x1f] < '\0') {
        auVar55 = vandps_avx(auVar55,auVar65);
        auVar22._4_4_ = auVar10._4_4_ * fVar83;
        auVar22._0_4_ = auVar10._0_4_ * fVar83;
        auVar22._8_4_ = auVar10._8_4_ * fVar83;
        auVar22._12_4_ = auVar10._12_4_ * fVar83;
        auVar22._16_4_ = fVar83 * 0.0;
        auVar22._20_4_ = fVar83 * 0.0;
        auVar22._24_4_ = fVar83 * 0.0;
        auVar22._28_4_ = fVar75;
        auVar6 = vfmadd213ps_fma(local_5d00,ZEXT1632(auVar12),auVar22);
        auVar6 = vfmadd213ps_fma(auVar117,ZEXT1632(auVar11),ZEXT1632(auVar6));
        auVar100._0_4_ = (float)(uVar103 ^ auVar6._0_4_);
        auVar100._4_4_ = (float)(uVar109 ^ auVar6._4_4_);
        auVar100._8_4_ = (float)(uVar110 ^ auVar6._8_4_);
        auVar100._12_4_ = (float)(uVar111 ^ auVar6._12_4_);
        auVar100._16_4_ = fVar112;
        auVar100._20_4_ = fVar74;
        auVar100._24_4_ = fVar80;
        auVar100._28_4_ = uVar47;
        auVar76 = vcmpps_avx(auVar100,_DAT_01faff00,5);
        auVar105 = auVar55 & auVar76;
        local_5d80 = auVar78;
        local_5c80 = auVar99;
        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0x7f,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar105 >> 0xbf,0) != '\0') ||
            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar105[0x1f] < '\0') {
          auVar105 = vandps_avx(ZEXT1632(auVar54),local_5ca0);
          auVar76 = vandps_avx(auVar55,auVar76);
          auVar55 = vsubps_avx(auVar105,auVar99);
          auVar55 = vcmpps_avx(auVar55,auVar100,5);
          auVar106 = auVar76 & auVar55;
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0x7f,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0xbf,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar106[0x1f] < '\0') {
            auVar76 = vandps_avx(auVar55,auVar76);
            auVar73 = ZEXT436(auVar76._28_4_);
            auVar25._4_4_ = auVar85._4_4_ * auVar15._4_4_;
            auVar25._0_4_ = auVar85._0_4_ * auVar15._0_4_;
            auVar25._8_4_ = auVar85._8_4_ * auVar15._8_4_;
            auVar25._12_4_ = auVar85._12_4_ * auVar15._12_4_;
            auVar25._16_4_ = auVar85._16_4_ * 0.0;
            auVar25._20_4_ = auVar85._20_4_ * 0.0;
            auVar25._24_4_ = auVar85._24_4_ * 0.0;
            auVar25._28_4_ = auVar85._28_4_;
            auVar6 = vfmadd213ps_fma(auVar84,ZEXT1632(auVar14),auVar25);
            auVar6 = vfmadd213ps_fma(auVar77,ZEXT1632(auVar13),ZEXT1632(auVar6));
            auVar91._0_4_ = (float)(uVar103 ^ auVar6._0_4_);
            auVar91._4_4_ = (float)(uVar109 ^ auVar6._4_4_);
            auVar91._8_4_ = (float)(uVar110 ^ auVar6._8_4_);
            auVar91._12_4_ = (float)(uVar111 ^ auVar6._12_4_);
            auVar91._16_4_ = fVar112;
            auVar91._20_4_ = fVar74;
            auVar91._24_4_ = fVar80;
            auVar91._28_4_ = uVar47;
            auVar94._0_4_ = auVar105._0_4_ * *(float *)(ray + 0x60);
            auVar94._4_4_ = auVar105._4_4_ * *(float *)(ray + 100);
            auVar94._8_4_ = auVar105._8_4_ * *(float *)(ray + 0x68);
            auVar94._12_4_ = auVar105._12_4_ * *(float *)(ray + 0x6c);
            auVar94._16_4_ = auVar105._16_4_ * *(float *)(ray + 0x70);
            auVar94._20_4_ = auVar105._20_4_ * *(float *)(ray + 0x74);
            auVar94._24_4_ = auVar105._24_4_ * *(float *)(ray + 0x78);
            auVar94._28_4_ = 0;
            auVar70 = vcmpps_avx(auVar94,auVar91,1);
            local_5d00 = *(undefined1 (*) [32])(ray + 0x100);
            auVar26._4_4_ = auVar105._4_4_ * *(float *)(ray + 0x104);
            auVar26._0_4_ = auVar105._0_4_ * *(float *)(ray + 0x100);
            auVar26._8_4_ = auVar105._8_4_ * *(float *)(ray + 0x108);
            auVar26._12_4_ = auVar105._12_4_ * *(float *)(ray + 0x10c);
            auVar26._16_4_ = auVar105._16_4_ * *(float *)(ray + 0x110);
            auVar26._20_4_ = auVar105._20_4_ * *(float *)(ray + 0x114);
            auVar26._24_4_ = auVar105._24_4_ * *(float *)(ray + 0x118);
            auVar26._28_4_ = auVar85._28_4_;
            auVar77 = vcmpps_avx(auVar91,auVar26,2);
            auVar70 = vandps_avx(auVar77,auVar70);
            auVar77 = auVar76 & auVar70;
            auVar66 = auVar67;
            if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar77 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar77 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar77 >> 0x7f,0) != '\0') ||
                  (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar77 >> 0xbf,0) != '\0') ||
                (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar77[0x1f] < '\0') {
              auVar76 = vandps_avx(auVar70,auVar76);
              auVar73 = ZEXT436(auVar76._28_4_);
              auVar70 = vcmpps_avx(ZEXT1632(auVar54),_DAT_01faff00,4);
              auVar77 = auVar76 & auVar70;
              if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar77 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar77 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar77 >> 0x7f,0) != '\0') ||
                    (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar77 >> 0xbf,0) != '\0') ||
                  (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar77[0x1f] < '\0') {
                auVar76 = vandps_avx(auVar70,auVar76);
                auVar73 = ZEXT436(auVar76._28_4_);
                pGVar3 = (context->scene->geometries).items[uVar104].ptr;
                local_5d20._0_8_ = pGVar3;
                uVar103 = pGVar3->mask;
                auVar95._4_4_ = uVar103;
                auVar95._0_4_ = uVar103;
                auVar95._8_4_ = uVar103;
                auVar95._12_4_ = uVar103;
                auVar95._16_4_ = uVar103;
                auVar95._20_4_ = uVar103;
                auVar95._24_4_ = uVar103;
                auVar95._28_4_ = uVar103;
                auVar70 = vpand_avx2(auVar95,*(undefined1 (*) [32])(ray + 0x120));
                auVar77 = vpcmpeqd_avx2(auVar70,_DAT_01faff00);
                auVar70 = auVar76 & ~auVar77;
                if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar70 >> 0x7f,0) != '\0') ||
                      (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar70 >> 0xbf,0) != '\0') ||
                    (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar70[0x1f] < '\0') {
                  auVar65 = vandnps_avx(auVar77,auVar76);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar70 = vrcpps_avx(auVar105);
                    auVar102._8_4_ = 0x3f800000;
                    auVar102._0_8_ = 0x3f8000003f800000;
                    auVar102._12_4_ = 0x3f800000;
                    auVar102._16_4_ = 0x3f800000;
                    auVar102._20_4_ = 0x3f800000;
                    auVar102._24_4_ = 0x3f800000;
                    auVar102._28_4_ = 0x3f800000;
                    auVar54 = vfnmadd213ps_fma(auVar105,auVar70,auVar102);
                    auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar70,auVar70);
                    fVar75 = auVar54._0_4_;
                    fVar81 = auVar54._4_4_;
                    auVar30._4_4_ = fVar81 * auVar99._4_4_;
                    auVar30._0_4_ = fVar75 * auVar99._0_4_;
                    fVar82 = auVar54._8_4_;
                    auVar30._8_4_ = fVar82 * auVar99._8_4_;
                    fVar83 = auVar54._12_4_;
                    auVar30._12_4_ = fVar83 * auVar99._12_4_;
                    auVar30._16_4_ = fVar112 * 0.0;
                    auVar30._20_4_ = fVar74 * 0.0;
                    auVar30._24_4_ = fVar80 * 0.0;
                    auVar30._28_4_ = *(undefined4 *)(ray + 0x11c);
                    auVar76 = vminps_avx(auVar30,auVar102);
                    auVar31._4_4_ = auVar100._4_4_ * fVar81;
                    auVar31._0_4_ = auVar100._0_4_ * fVar75;
                    auVar31._8_4_ = auVar100._8_4_ * fVar82;
                    auVar31._12_4_ = auVar100._12_4_ * fVar83;
                    auVar31._16_4_ = fVar112 * 0.0;
                    auVar31._20_4_ = fVar74 * 0.0;
                    auVar31._24_4_ = fVar80 * 0.0;
                    auVar31._28_4_ = auVar70._28_4_;
                    auVar70 = vminps_avx(auVar31,auVar102);
                    auVar77 = vsubps_avx(auVar102,auVar76);
                    auVar84 = vsubps_avx(auVar102,auVar70);
                    auVar33._8_8_ = uStack_5af8;
                    auVar33._0_8_ = local_5b00;
                    auVar33._16_8_ = uStack_5af0;
                    auVar33._24_8_ = uStack_5ae8;
                    local_5be0 = vblendvps_avx(auVar76,auVar77,auVar33);
                    local_5bc0 = vblendvps_avx(auVar70,auVar84,auVar33);
                    pRVar4 = context->user;
                    local_5b80._4_4_ = uVar104;
                    local_5b80._0_4_ = uVar104;
                    local_5b80._8_4_ = uVar104;
                    local_5b80._12_4_ = uVar104;
                    local_5b80._16_4_ = uVar104;
                    local_5b80._20_4_ = uVar104;
                    local_5b80._24_4_ = uVar104;
                    local_5b80._28_4_ = uVar104;
                    local_5ba0._4_4_ = iVar40;
                    local_5ba0._0_4_ = iVar40;
                    local_5ba0._8_4_ = iVar40;
                    local_5ba0._12_4_ = iVar40;
                    local_5ba0._16_4_ = iVar40;
                    local_5ba0._20_4_ = iVar40;
                    local_5ba0._24_4_ = iVar40;
                    local_5ba0._28_4_ = iVar40;
                    local_5c40 = (RTCHitN  [32])ZEXT1632(auVar13);
                    local_5c20 = ZEXT1632(auVar14);
                    auVar76 = vpcmpeqd_avx2((undefined1  [32])local_5c40,
                                            (undefined1  [32])local_5c40);
                    local_5e38[1] = auVar76;
                    *local_5e38 = auVar76;
                    local_5b60 = pRVar4->instID[0];
                    local_5b40 = pRVar4->instPrimID[0];
                    auVar58._0_4_ = fVar75 * auVar91._0_4_;
                    auVar58._4_4_ = fVar81 * auVar91._4_4_;
                    auVar58._8_4_ = fVar82 * auVar91._8_4_;
                    auVar58._12_4_ = fVar83 * auVar91._12_4_;
                    auVar58._16_4_ = fVar112 * 0.0;
                    auVar58._20_4_ = fVar74 * 0.0;
                    auVar58._24_4_ = fVar80 * 0.0;
                    auVar58._28_4_ = 0;
                    auVar76 = vblendvps_avx(local_5d00,auVar58,auVar65);
                    *(undefined1 (*) [32])(ray + 0x100) = auVar76;
                    local_5e30.valid = (int *)local_5dc0;
                    local_5e30.geometryUserPtr = pGVar3->userPtr;
                    local_5e30.context = context->user;
                    local_5e30.hit = local_5c40;
                    local_5e30.N = 8;
                    local_5e30.ray = (RTCRayN *)ray;
                    local_5dc0 = auVar65;
                    local_5c00 = ZEXT1632(auVar15);
                    uStack_5b5c = local_5b60;
                    uStack_5b58 = local_5b60;
                    uStack_5b54 = local_5b60;
                    uStack_5b50 = local_5b60;
                    uStack_5b4c = local_5b60;
                    uStack_5b48 = local_5b60;
                    uStack_5b44 = local_5b60;
                    uStack_5b3c = local_5b40;
                    uStack_5b38 = local_5b40;
                    uStack_5b34 = local_5b40;
                    uStack_5b30 = local_5b40;
                    uStack_5b2c = local_5b40;
                    uStack_5b28 = local_5b40;
                    uStack_5b24 = local_5b40;
                    auVar68 = (undefined1  [36])0x0;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar68 = (undefined1  [36])0x0;
                      auVar55 = ZEXT1632(auVar55._0_16_);
                      (*pGVar3->occlusionFilterN)(&local_5e30);
                    }
                    auVar65 = vpcmpeqd_avx2(local_5dc0,_DAT_01faff00);
                    auVar76 = _DAT_01fe9960 & ~auVar65;
                    if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar76 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar76 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar76 >> 0x7f,0) == '\0') &&
                          (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar76 >> 0xbf,0) == '\0') &&
                        (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar76[0x1f]) {
                      auVar65 = auVar65 ^ _DAT_01fe9960;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_5d20._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar68 = (undefined1  [36])0x0;
                        auVar55 = ZEXT1632(auVar55._0_16_);
                        (*p_Var5)(&local_5e30);
                      }
                      auVar76 = vpcmpeqd_avx2(local_5dc0,_DAT_01faff00);
                      auVar65 = auVar76 ^ _DAT_01fe9960;
                      auVar60._8_4_ = 0xff800000;
                      auVar60._0_8_ = 0xff800000ff800000;
                      auVar60._12_4_ = 0xff800000;
                      auVar60._16_4_ = 0xff800000;
                      auVar60._20_4_ = 0xff800000;
                      auVar60._24_4_ = 0xff800000;
                      auVar60._28_4_ = 0xff800000;
                      auVar76 = vblendvps_avx(auVar60,*(undefined1 (*) [32])(local_5e30.ray + 0x100)
                                              ,auVar76);
                      *(undefined1 (*) [32])(local_5e30.ray + 0x100) = auVar76;
                    }
                    auVar76 = vblendvps_avx(local_5d00,*(undefined1 (*) [32])local_5e40,auVar65);
                    *(undefined1 (*) [32])local_5e40 = auVar76;
                  }
                  auVar73 = ZEXT436(auVar65._28_4_);
                  auVar65 = vandnps_avx(auVar65,local_5e60);
                  auVar66 = auVar68;
                }
              }
            }
            auVar108 = ZEXT3264(auVar65);
            auVar117 = local_5d60;
            auVar78 = local_5d80;
            auVar70 = local_5d60;
            goto LAB_0060633a;
          }
        }
        auVar73 = ZEXT436(auVar76._28_4_);
      }
LAB_0060633a:
      local_5d60 = auVar117;
      auVar65 = auVar108._0_32_;
      if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar65 >> 0x7f,0) == '\0') &&
            (auVar108 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar65 >> 0xbf,0) == '\0') &&
          (auVar108 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar108[0x1f]) {
        auVar108 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
        auVar114 = ZEXT3264(auVar55);
        break;
      }
      auVar84 = vsubps_avx(auVar78,_local_5ce0);
      auVar34._4_4_ = fStack_5abc;
      auVar34._0_4_ = local_5ac0;
      auVar34._8_4_ = fStack_5ab8;
      auVar34._12_4_ = fStack_5ab4;
      auVar34._16_4_ = fStack_5ab0;
      auVar34._20_4_ = fStack_5aac;
      auVar34._24_4_ = fStack_5aa8;
      auVar34._28_4_ = fStack_5aa4;
      auVar36._4_4_ = fStack_5a5c;
      auVar36._0_4_ = local_5a60;
      auVar36._8_4_ = fStack_5a58;
      auVar36._12_4_ = fStack_5a54;
      auVar36._16_4_ = fStack_5a50;
      auVar36._20_4_ = fStack_5a4c;
      auVar36._24_4_ = fStack_5a48;
      auVar36._28_4_ = fStack_5a44;
      auVar85 = vsubps_avx(auVar34,auVar36);
      auVar35._4_4_ = fStack_5a7c;
      auVar35._0_4_ = local_5a80;
      auVar35._8_4_ = fStack_5a78;
      auVar35._12_4_ = fStack_5a74;
      auVar35._16_4_ = fStack_5a70;
      auVar35._20_4_ = fStack_5a6c;
      auVar35._24_4_ = fStack_5a68;
      auVar35._28_4_ = fStack_5a64;
      auVar105 = vsubps_avx(auVar70,auVar35);
      auVar106 = vsubps_avx(_local_5e00,auVar78);
      auVar53 = vsubps_avx(_local_5de0,auVar34);
      auVar56 = vsubps_avx(_local_5cc0,auVar70);
      auVar114._0_4_ = auVar56._0_4_ * auVar85._0_4_;
      auVar114._4_4_ = auVar56._4_4_ * auVar85._4_4_;
      auVar114._8_4_ = auVar56._8_4_ * auVar85._8_4_;
      auVar114._12_4_ = auVar56._12_4_ * auVar85._12_4_;
      auVar114._16_4_ = auVar56._16_4_ * auVar85._16_4_;
      auVar114._20_4_ = auVar56._20_4_ * auVar85._20_4_;
      auVar114._24_4_ = auVar56._24_4_ * auVar85._24_4_;
      auVar114._28_36_ = auVar66;
      auVar13 = vfmsub231ps_fma(auVar114._0_32_,auVar53,auVar105);
      auVar72._0_4_ = auVar105._0_4_ * auVar106._0_4_;
      auVar72._4_4_ = auVar105._4_4_ * auVar106._4_4_;
      auVar72._8_4_ = auVar105._8_4_ * auVar106._8_4_;
      auVar72._12_4_ = auVar105._12_4_ * auVar106._12_4_;
      auVar72._16_4_ = auVar105._16_4_ * auVar106._16_4_;
      auVar72._20_4_ = auVar105._20_4_ * auVar106._20_4_;
      auVar72._24_4_ = auVar105._24_4_ * auVar106._24_4_;
      auVar72._28_36_ = auVar73;
      auVar14 = vfmsub231ps_fma(auVar72._0_32_,auVar56,auVar84);
      auVar17._4_4_ = auVar53._4_4_ * auVar84._4_4_;
      auVar17._0_4_ = auVar53._0_4_ * auVar84._0_4_;
      auVar17._8_4_ = auVar53._8_4_ * auVar84._8_4_;
      auVar17._12_4_ = auVar53._12_4_ * auVar84._12_4_;
      auVar17._16_4_ = auVar53._16_4_ * auVar84._16_4_;
      auVar17._20_4_ = auVar53._20_4_ * auVar84._20_4_;
      auVar17._24_4_ = auVar53._24_4_ * auVar84._24_4_;
      auVar17._28_4_ = auVar84._28_4_;
      auVar15 = vfmsub231ps_fma(auVar17,auVar106,auVar85);
      auVar7 = vsubps_avx(auVar78,*(undefined1 (*) [32])ray);
      auVar8 = vsubps_avx(auVar34,*(undefined1 (*) [32])(ray + 0x20));
      auVar9 = vsubps_avx(auVar70,*(undefined1 (*) [32])(ray + 0x40));
      auVar55 = *(undefined1 (*) [32])(ray + 0x80);
      auVar76 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar116._0_4_ = auVar55._0_4_ * auVar8._0_4_;
      auVar116._4_4_ = auVar55._4_4_ * auVar8._4_4_;
      auVar116._8_4_ = auVar55._8_4_ * auVar8._8_4_;
      auVar116._12_4_ = auVar55._12_4_ * auVar8._12_4_;
      auVar116._16_4_ = auVar55._16_4_ * auVar8._16_4_;
      auVar116._20_4_ = auVar55._20_4_ * auVar8._20_4_;
      auVar116._28_36_ = auVar108._28_36_;
      auVar116._24_4_ = auVar55._24_4_ * auVar8._24_4_;
      auVar10 = vfmsub231ps_fma(auVar116._0_32_,auVar7,auVar76);
      auVar77 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar79 = ZEXT1632(auVar15);
      auVar18._4_4_ = auVar77._4_4_ * auVar15._4_4_;
      auVar18._0_4_ = auVar77._0_4_ * auVar15._0_4_;
      auVar18._8_4_ = auVar77._8_4_ * auVar15._8_4_;
      auVar18._12_4_ = auVar77._12_4_ * auVar15._12_4_;
      auVar18._16_4_ = auVar77._16_4_ * 0.0;
      auVar18._20_4_ = auVar77._20_4_ * 0.0;
      auVar18._24_4_ = auVar77._24_4_ * 0.0;
      auVar18._28_4_ = auVar70._28_4_;
      auVar70 = ZEXT1632(auVar14);
      auVar54 = vfmadd231ps_fma(auVar18,auVar70,auVar76);
      auVar19._4_4_ = auVar76._4_4_ * auVar9._4_4_;
      auVar19._0_4_ = auVar76._0_4_ * auVar9._0_4_;
      auVar19._8_4_ = auVar76._8_4_ * auVar9._8_4_;
      auVar19._12_4_ = auVar76._12_4_ * auVar9._12_4_;
      auVar19._16_4_ = auVar76._16_4_ * auVar9._16_4_;
      auVar19._20_4_ = auVar76._20_4_ * auVar9._20_4_;
      auVar19._24_4_ = auVar76._24_4_ * auVar9._24_4_;
      auVar19._28_4_ = auVar76._28_4_;
      auVar11 = vfmsub231ps_fma(auVar19,auVar8,auVar77);
      auVar20._4_4_ = auVar77._4_4_ * auVar7._4_4_;
      auVar20._0_4_ = auVar77._0_4_ * auVar7._0_4_;
      auVar20._8_4_ = auVar77._8_4_ * auVar7._8_4_;
      auVar20._12_4_ = auVar77._12_4_ * auVar7._12_4_;
      auVar20._16_4_ = auVar77._16_4_ * auVar7._16_4_;
      auVar20._20_4_ = auVar77._20_4_ * auVar7._20_4_;
      auVar20._24_4_ = auVar77._24_4_ * auVar7._24_4_;
      auVar20._28_4_ = auVar77._28_4_;
      auVar12 = vfmsub231ps_fma(auVar20,auVar9,auVar55);
      auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),ZEXT1632(auVar13),auVar55);
      auVar21._4_4_ = auVar56._4_4_ * auVar10._4_4_;
      auVar21._0_4_ = auVar56._0_4_ * auVar10._0_4_;
      auVar21._8_4_ = auVar56._8_4_ * auVar10._8_4_;
      auVar21._12_4_ = auVar56._12_4_ * auVar10._12_4_;
      auVar21._16_4_ = auVar56._16_4_ * 0.0;
      auVar21._20_4_ = auVar56._20_4_ * 0.0;
      auVar21._24_4_ = auVar56._24_4_ * 0.0;
      auVar21._28_4_ = auVar55._28_4_;
      auVar6 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar12),auVar53);
      auVar55 = vandps_avx(ZEXT1632(auVar54),local_5aa0);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar11),auVar106);
      uVar104 = auVar55._0_4_;
      auVar88._0_4_ = (float)(uVar104 ^ auVar6._0_4_);
      uVar103 = auVar55._4_4_;
      auVar88._4_4_ = (float)(uVar103 ^ auVar6._4_4_);
      uVar109 = auVar55._8_4_;
      auVar88._8_4_ = (float)(uVar109 ^ auVar6._8_4_);
      uVar110 = auVar55._12_4_;
      auVar88._12_4_ = (float)(uVar110 ^ auVar6._12_4_);
      fVar75 = auVar55._16_4_;
      auVar88._16_4_ = fVar75;
      fVar81 = auVar55._20_4_;
      auVar88._20_4_ = fVar81;
      fVar112 = auVar55._24_4_;
      auVar88._24_4_ = fVar112;
      uVar47 = auVar55._28_4_;
      auVar88._28_4_ = uVar47;
      auVar55 = vcmpps_avx(auVar88,_DAT_01faff00,5);
      auVar76 = auVar65 & auVar55;
      bVar49 = true;
      local_5e60 = auVar65;
      _local_5de0 = auVar85;
      if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar76 >> 0x7f,0) != '\0') ||
            (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar76 >> 0xbf,0) != '\0') ||
          (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar76[0x1f] < '\0') {
        auVar55 = vandps_avx(auVar55,auVar65);
        auVar51._0_4_ = auVar105._0_4_ * auVar10._0_4_;
        auVar51._4_4_ = auVar105._4_4_ * auVar10._4_4_;
        auVar51._8_4_ = auVar105._8_4_ * auVar10._8_4_;
        auVar51._12_4_ = auVar105._12_4_ * auVar10._12_4_;
        auVar51._16_4_ = auVar105._16_4_ * 0.0;
        auVar51._20_4_ = auVar105._20_4_ * 0.0;
        auVar51._24_4_ = auVar105._24_4_ * 0.0;
        auVar51._28_4_ = 0;
        auVar6 = vfmadd213ps_fma(auVar85,ZEXT1632(auVar12),auVar51);
        auVar6 = vfmadd213ps_fma(auVar84,ZEXT1632(auVar11),ZEXT1632(auVar6));
        auVar93._0_4_ = (float)(uVar104 ^ auVar6._0_4_);
        auVar93._4_4_ = (float)(uVar103 ^ auVar6._4_4_);
        auVar93._8_4_ = (float)(uVar109 ^ auVar6._8_4_);
        auVar93._12_4_ = (float)(uVar110 ^ auVar6._12_4_);
        auVar93._16_4_ = fVar75;
        auVar93._20_4_ = fVar81;
        auVar93._24_4_ = fVar112;
        auVar93._28_4_ = uVar47;
        auVar76 = vcmpps_avx(auVar93,_DAT_01faff00,5);
        auVar77 = auVar55 & auVar76;
        _local_5ce0 = auVar79;
        _local_5cc0 = auVar70;
        if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar77 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar77 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar77 >> 0x7f,0) != '\0') ||
              (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar77 >> 0xbf,0) != '\0') ||
            (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar77[0x1f] < '\0') {
          auVar77 = vandps_avx(ZEXT1632(auVar54),local_5ca0);
          auVar76 = vandps_avx(auVar76,auVar55);
          auVar85 = vsubps_avx(auVar77,auVar88);
          auVar55 = vcmpps_avx(auVar85,auVar93,5);
          auVar105 = auVar76 & auVar55;
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar105 >> 0x7f,0) != '\0') ||
                (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0xbf,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar105[0x1f] < '\0') {
            auVar76 = vandps_avx(auVar55,auVar76);
            auVar23._4_4_ = auVar9._4_4_ * auVar15._4_4_;
            auVar23._0_4_ = auVar9._0_4_ * auVar15._0_4_;
            auVar23._8_4_ = auVar9._8_4_ * auVar15._8_4_;
            auVar23._12_4_ = auVar9._12_4_ * auVar15._12_4_;
            auVar23._16_4_ = auVar9._16_4_ * 0.0;
            auVar23._20_4_ = auVar9._20_4_ * 0.0;
            auVar23._24_4_ = auVar9._24_4_ * 0.0;
            auVar23._28_4_ = auVar85._28_4_;
            auVar6 = vfmadd132ps_fma(auVar8,auVar23,auVar70);
            auVar6 = vfmadd213ps_fma(auVar7,ZEXT1632(auVar13),ZEXT1632(auVar6));
            auVar90._0_4_ = (float)(uVar104 ^ auVar6._0_4_);
            auVar90._4_4_ = (float)(uVar103 ^ auVar6._4_4_);
            auVar90._8_4_ = (float)(uVar109 ^ auVar6._8_4_);
            auVar90._12_4_ = (float)(uVar110 ^ auVar6._12_4_);
            auVar90._16_4_ = fVar75;
            auVar90._20_4_ = fVar81;
            auVar90._24_4_ = fVar112;
            auVar90._28_4_ = uVar47;
            auVar24._4_4_ = auVar77._4_4_ * *(float *)(ray + 100);
            auVar24._0_4_ = auVar77._0_4_ * *(float *)(ray + 0x60);
            auVar24._8_4_ = auVar77._8_4_ * *(float *)(ray + 0x68);
            auVar24._12_4_ = auVar77._12_4_ * *(float *)(ray + 0x6c);
            auVar24._16_4_ = auVar77._16_4_ * *(float *)(ray + 0x70);
            auVar24._20_4_ = auVar77._20_4_ * *(float *)(ray + 0x74);
            auVar24._24_4_ = auVar77._24_4_ * *(float *)(ray + 0x78);
            auVar24._28_4_ = auVar85._28_4_;
            auVar70 = vcmpps_avx(auVar24,auVar90,1);
            _local_5de0 = *(undefined1 (*) [32])(ray + 0x100);
            auVar71._0_4_ = auVar77._0_4_ * *(float *)(ray + 0x100);
            auVar71._4_4_ = auVar77._4_4_ * *(float *)(ray + 0x104);
            auVar71._8_4_ = auVar77._8_4_ * *(float *)(ray + 0x108);
            auVar71._12_4_ = auVar77._12_4_ * *(float *)(ray + 0x10c);
            auVar71._16_4_ = auVar77._16_4_ * *(float *)(ray + 0x110);
            auVar71._20_4_ = auVar77._20_4_ * *(float *)(ray + 0x114);
            auVar71._24_4_ = auVar77._24_4_ * *(float *)(ray + 0x118);
            auVar71._28_4_ = 0;
            auVar85 = vcmpps_avx(auVar90,auVar71,2);
            auVar70 = vandps_avx(auVar85,auVar70);
            auVar85 = auVar76 & auVar70;
            if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar85 >> 0x7f,0) != '\0') ||
                  (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar85 >> 0xbf,0) != '\0') ||
                (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar85[0x1f] < '\0') {
              auVar76 = vandps_avx(auVar76,auVar70);
              auVar70 = vcmpps_avx(ZEXT1632(auVar54),_DAT_01faff00,4);
              auVar85 = auVar76 & auVar70;
              if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar85 >> 0x7f,0) != '\0') ||
                    (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar85 >> 0xbf,0) != '\0') ||
                  (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar85[0x1f] < '\0') {
                auVar76 = vandps_avx(auVar70,auVar76);
                uVar103 = *(uint *)(lVar42 + -0x10 + uVar48 * 4);
                local_5e00 = (undefined1  [8])(context->scene->geometries).items[uVar103].ptr;
                _auStack_5df8 = auVar84._8_24_;
                uVar104 = ((Geometry *)local_5e00)->mask;
                auVar52._4_4_ = uVar104;
                auVar52._0_4_ = uVar104;
                auVar52._8_4_ = uVar104;
                auVar52._12_4_ = uVar104;
                auVar52._16_4_ = uVar104;
                auVar52._20_4_ = uVar104;
                auVar52._24_4_ = uVar104;
                auVar52._28_4_ = uVar104;
                auVar70 = vpand_avx2(auVar52,*(undefined1 (*) [32])(ray + 0x120));
                auVar84 = vpcmpeqd_avx2(auVar70,_DAT_01faff00);
                auVar70 = auVar76 & ~auVar84;
                if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar70 >> 0x7f,0) != '\0') ||
                      (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar70 >> 0xbf,0) != '\0') ||
                    (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar70[0x1f] < '\0') {
                  uVar1 = *(undefined4 *)(lVar42 + uVar48 * 4);
                  auVar65 = vandnps_avx(auVar84,auVar76);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (((Geometry *)local_5e00)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar76 = vrcpps_avx(auVar77);
                    auVar98._8_4_ = 0x3f800000;
                    auVar98._0_8_ = 0x3f8000003f800000;
                    auVar98._12_4_ = 0x3f800000;
                    auVar98._16_4_ = 0x3f800000;
                    auVar98._20_4_ = 0x3f800000;
                    auVar98._24_4_ = 0x3f800000;
                    auVar98._28_4_ = 0x3f800000;
                    auVar54 = vfnmadd213ps_fma(auVar77,auVar76,auVar98);
                    auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar76,auVar76);
                    fVar74 = auVar54._0_4_;
                    fVar80 = auVar54._4_4_;
                    auVar27._4_4_ = fVar80 * auVar88._4_4_;
                    auVar27._0_4_ = fVar74 * auVar88._0_4_;
                    fVar82 = auVar54._8_4_;
                    auVar27._8_4_ = fVar82 * auVar88._8_4_;
                    fVar83 = auVar54._12_4_;
                    auVar27._12_4_ = fVar83 * auVar88._12_4_;
                    auVar27._16_4_ = fVar75 * 0.0;
                    auVar27._20_4_ = fVar81 * 0.0;
                    auVar27._24_4_ = fVar112 * 0.0;
                    auVar27._28_4_ = auVar76._28_4_;
                    auVar76 = vminps_avx(auVar27,auVar98);
                    auVar28._4_4_ = fVar80 * auVar93._4_4_;
                    auVar28._0_4_ = fVar74 * auVar93._0_4_;
                    auVar28._8_4_ = fVar82 * auVar93._8_4_;
                    auVar28._12_4_ = fVar83 * auVar93._12_4_;
                    auVar28._16_4_ = fVar75 * 0.0;
                    auVar28._20_4_ = fVar81 * 0.0;
                    auVar28._24_4_ = fVar112 * 0.0;
                    auVar28._28_4_ = uVar47;
                    auVar70 = vminps_avx(auVar28,auVar98);
                    auVar77 = vsubps_avx(auVar98,auVar76);
                    auVar84 = vsubps_avx(auVar98,auVar70);
                    auVar32._8_8_ = uStack_5b18;
                    auVar32._0_8_ = local_5b20;
                    auVar32._16_8_ = uStack_5b10;
                    auVar32._24_8_ = uStack_5b08;
                    local_5be0 = vblendvps_avx(auVar76,auVar77,auVar32);
                    local_5bc0 = vblendvps_avx(auVar70,auVar84,auVar32);
                    pRVar4 = context->user;
                    local_5b80._4_4_ = uVar103;
                    local_5b80._0_4_ = uVar103;
                    local_5b80._8_4_ = uVar103;
                    local_5b80._12_4_ = uVar103;
                    local_5b80._16_4_ = uVar103;
                    local_5b80._20_4_ = uVar103;
                    local_5b80._24_4_ = uVar103;
                    local_5b80._28_4_ = uVar103;
                    local_5ba0._4_4_ = uVar1;
                    local_5ba0._0_4_ = uVar1;
                    local_5ba0._8_4_ = uVar1;
                    local_5ba0._12_4_ = uVar1;
                    local_5ba0._16_4_ = uVar1;
                    local_5ba0._20_4_ = uVar1;
                    local_5ba0._24_4_ = uVar1;
                    local_5ba0._28_4_ = uVar1;
                    local_5c40 = (RTCHitN  [32])ZEXT1632(auVar13);
                    local_5c20 = ZEXT1632(auVar14);
                    local_5c00 = ZEXT1632(auVar15);
                    auVar76 = vpcmpeqd_avx2(local_5be0,local_5be0);
                    local_5e38[1] = auVar76;
                    *local_5e38 = auVar76;
                    local_5b60 = pRVar4->instID[0];
                    local_5b40 = pRVar4->instPrimID[0];
                    auVar29._4_4_ = fVar80 * auVar90._4_4_;
                    auVar29._0_4_ = fVar74 * auVar90._0_4_;
                    auVar29._8_4_ = fVar82 * auVar90._8_4_;
                    auVar29._12_4_ = fVar83 * auVar90._12_4_;
                    auVar29._16_4_ = fVar75 * 0.0;
                    auVar29._20_4_ = fVar81 * 0.0;
                    auVar29._24_4_ = fVar112 * 0.0;
                    auVar29._28_4_ = 0;
                    auVar76 = vblendvps_avx(_local_5de0,auVar29,auVar65);
                    *(undefined1 (*) [32])(ray + 0x100) = auVar76;
                    local_5e30.valid = (int *)local_5dc0;
                    local_5e30.geometryUserPtr = ((Geometry *)local_5e00)->userPtr;
                    local_5e30.context = context->user;
                    local_5e30.hit = local_5c40;
                    local_5e30.N = 8;
                    local_5e30.ray = (RTCRayN *)ray;
                    local_5dc0 = auVar65;
                    uStack_5b5c = local_5b60;
                    uStack_5b58 = local_5b60;
                    uStack_5b54 = local_5b60;
                    uStack_5b50 = local_5b60;
                    uStack_5b4c = local_5b60;
                    uStack_5b48 = local_5b60;
                    uStack_5b44 = local_5b60;
                    uStack_5b3c = local_5b40;
                    uStack_5b38 = local_5b40;
                    uStack_5b34 = local_5b40;
                    uStack_5b30 = local_5b40;
                    uStack_5b2c = local_5b40;
                    uStack_5b28 = local_5b40;
                    uStack_5b24 = local_5b40;
                    if (((Geometry *)local_5e00)->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar55 = ZEXT1632(auVar55._0_16_);
                      (*((Geometry *)local_5e00)->occlusionFilterN)(&local_5e30);
                    }
                    auVar65 = vpcmpeqd_avx2(local_5dc0,_DAT_01faff00);
                    auVar76 = _DAT_01fe9960 & ~auVar65;
                    if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar76 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar76 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar76 >> 0x7f,0) == '\0') &&
                          (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar76 >> 0xbf,0) == '\0') &&
                        (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar76[0x1f]) {
                      auVar65 = auVar65 ^ _DAT_01fe9960;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)((long)local_5e00 + 0x3e) & 0x40) != 0)))) {
                        auVar55 = ZEXT1632(auVar55._0_16_);
                        (*p_Var5)(&local_5e30);
                      }
                      auVar76 = vpcmpeqd_avx2(local_5dc0,_DAT_01faff00);
                      auVar65 = auVar76 ^ _DAT_01fe9960;
                      auVar59._8_4_ = 0xff800000;
                      auVar59._0_8_ = 0xff800000ff800000;
                      auVar59._12_4_ = 0xff800000;
                      auVar59._16_4_ = 0xff800000;
                      auVar59._20_4_ = 0xff800000;
                      auVar59._24_4_ = 0xff800000;
                      auVar59._28_4_ = 0xff800000;
                      auVar76 = vblendvps_avx(auVar59,*(undefined1 (*) [32])(local_5e30.ray + 0x100)
                                              ,auVar76);
                      *(undefined1 (*) [32])(local_5e30.ray + 0x100) = auVar76;
                    }
                    auVar76 = vblendvps_avx(_local_5de0,*(undefined1 (*) [32])local_5e40,auVar65);
                    *(undefined1 (*) [32])local_5e40 = auVar76;
                  }
                  auVar76 = local_5e60 & ~auVar65;
                  auVar65 = vandnps_avx(auVar65,local_5e60);
                  bVar49 = (((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                || (auVar76 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                               (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || SUB321(auVar76 >> 0x7f,0) != '\0') ||
                             (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            SUB321(auVar76 >> 0xbf,0) != '\0') ||
                           (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           auVar76[0x1f] < '\0';
                }
              }
            }
          }
        }
      }
      auVar108 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
      auVar114 = ZEXT3264(auVar55);
      if ((!bVar49) || (unaff_R15 = uVar48 + 1, bVar49 = 2 < uVar48, uVar48 = unaff_R15, bVar49))
      break;
    }
    auVar56 = vandps_avx(auVar65,local_5c60);
    auVar65 = local_5c60 & auVar65;
    if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar65 >> 0x7f,0) == '\0') &&
          (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar65 >> 0xbf,0) == '\0') &&
        (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar65[0x1f])
    break;
  }
  auVar53._0_4_ = auVar114._0_4_ ^ auVar56._0_4_;
  auVar53._4_4_ = auVar114._4_4_ ^ auVar56._4_4_;
  auVar53._8_4_ = auVar114._8_4_ ^ auVar56._8_4_;
  auVar53._12_4_ = auVar114._12_4_ ^ auVar56._12_4_;
  auVar53._16_4_ = auVar114._16_4_ ^ auVar56._16_4_;
  auVar53._20_4_ = auVar114._20_4_ ^ auVar56._20_4_;
  auVar53._24_4_ = auVar114._24_4_ ^ auVar56._24_4_;
  auVar53._28_4_ = auVar114._28_4_ ^ auVar56._28_4_;
LAB_00606cb1:
  local_5d40 = vorps_avx(local_5d40,auVar53);
  auVar65 = auVar114._0_32_ & ~local_5d40;
  if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar65 >> 0x7f,0) == '\0') &&
        (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar65 >> 0xbf,0) == '\0') &&
      (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar65[0x1f])
  goto LAB_00606dda;
  auVar64._8_4_ = 0xff800000;
  auVar64._0_8_ = 0xff800000ff800000;
  auVar64._12_4_ = 0xff800000;
  auVar64._16_4_ = 0xff800000;
  auVar64._20_4_ = 0xff800000;
  auVar64._24_4_ = 0xff800000;
  auVar64._28_4_ = 0xff800000;
  local_5840 = vblendvps_avx(local_5840,auVar64,local_5d40);
  goto LAB_00605f27;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }